

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O1

ze_result_t
zetGetMetricExpProcAddrTable(ze_api_version_t version,zet_metric_exp_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t zVar2;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (zet_metric_exp_dditable_t *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar2 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(zet_pfnMetricCreateFromProgrammableExp2_t *)(validation_layer::context + 0x1d4) =
           pDdiTable->pfnCreateFromProgrammableExp2;
      pDdiTable->pfnCreateFromProgrammableExp2 =
           validation_layer::zetMetricCreateFromProgrammableExp2;
      *(zet_pfnMetricCreateFromProgrammableExp_t *)(pzVar1 + 0x1d0) =
           pDdiTable->pfnCreateFromProgrammableExp;
      pDdiTable->pfnCreateFromProgrammableExp = validation_layer::zetMetricCreateFromProgrammableExp
      ;
      *(zet_pfnMetricDestroyExp_t *)(pzVar1 + 0x1d2) = pDdiTable->pfnDestroyExp;
      pDdiTable->pfnDestroyExp = validation_layer::zetMetricDestroyExp;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_exp_dditable_t* pDdiTable            ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zetDdiTable.MetricExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreateFromProgrammableExp2               = pDdiTable->pfnCreateFromProgrammableExp2;
    pDdiTable->pfnCreateFromProgrammableExp2             = validation_layer::zetMetricCreateFromProgrammableExp2;

    dditable.pfnCreateFromProgrammableExp                = pDdiTable->pfnCreateFromProgrammableExp;
    pDdiTable->pfnCreateFromProgrammableExp              = validation_layer::zetMetricCreateFromProgrammableExp;

    dditable.pfnDestroyExp                               = pDdiTable->pfnDestroyExp;
    pDdiTable->pfnDestroyExp                             = validation_layer::zetMetricDestroyExp;

    return result;
}